

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  ExprType EVar1;
  pointer pEVar2;
  Expr *pEVar3;
  char *__function;
  long lVar4;
  ExprList *exprs;
  Expr *pEVar5;
  pointer pEVar6;
  ExprVisitor visitor;
  ExprVisitorDelegate delegate;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_c8;
  Index local_b0;
  ExprVisitor local_a8;
  Delegate local_40;
  WatWriter *local_38;
  
  pEVar6 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar6 == pEVar2) {
      return;
    }
    pEVar3 = pEVar6->expr;
    lVar4 = (long)(pEVar6->children).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar6->children).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_c8.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start =
         std::
         _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                        *)((lVar4 >> 3) * -0x3333333333333333),(size_t)expr_trees);
    local_c8.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(lVar4 + (long)local_c8.
                                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    local_c8.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         std::__uninitialized_copy<false>::
         __uninit_copy<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>,wabt::(anonymous_namespace)::ExprTree*>
                   ((pEVar6->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (pEVar6->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    local_c8.
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    local_b0 = pEVar6->result_count;
    EVar1 = pEVar3->type_;
    WritePuts(this,"(",None);
    if ((int)EVar1 < 0x1b) {
      if (EVar1 == Block) {
        if (pEVar3->type_ == Block) {
          Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Block_Opcode);
          WriteBeginBlock(this,Block,(Block *)(pEVar3 + 1),(char *)local_a8.delegate_);
          if (pEVar3->type_ == Block) {
LAB_00142f5f:
            WriteFoldedExprList(this,(ExprList *)
                                     &pEVar3[5].super_intrusive_list_base<wabt::Expr>.prev_);
            FlushExprTreeStack(this);
            goto LAB_00142f79;
          }
        }
        __function = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
        ;
LAB_00143042:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                      ,0x48,__function);
      }
      if (EVar1 == If) {
        Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::If_Opcode);
        WriteBeginBlock(this,If,(Block *)(pEVar3 + 1),(char *)local_a8.delegate_);
        FlushExprTreeVector(this,&local_c8);
        WritePuts(this,"(",None);
        WritePuts(this,"then",Newline);
        this->indent_ = this->indent_ + 2;
        WriteFoldedExprList(this,(ExprList *)&pEVar3[5].super_intrusive_list_base<wabt::Expr>.prev_)
        ;
        FlushExprTreeStack(this);
        WriteClose(this,Newline);
        if (pEVar3[6].loc.filename._M_len != 0) {
          WritePuts(this,"(",None);
          WritePuts(this,"else",Newline);
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,(ExprList *)&pEVar3[6].super_intrusive_list_base<wabt::Expr>);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
        }
        goto LAB_00142f79;
      }
LAB_00142e26:
      local_40._vptr_Delegate = (_func_int **)&PTR__Delegate_0018c550;
      local_38 = this;
      ExprVisitor::ExprVisitor(&local_a8,&local_40);
      ExprVisitor::VisitExpr(&local_a8,pEVar3);
      if (local_a8.catch_index_stack_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.catch_index_stack_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.catch_index_stack_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.catch_index_stack_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.expr_iter_stack_.
          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.expr_iter_stack_.
                        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.expr_stack_.
                        super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.state_stack_.
          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.state_stack_.
                        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      this->indent_ = this->indent_ + 2;
      FlushExprTreeVector(this,&local_c8);
      expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)0x2;
      WriteClose(this,Newline);
    }
    else {
      if (EVar1 == Loop) {
        if (pEVar3->type_ == Loop) {
          Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Loop_Opcode);
          WriteBeginBlock(this,Loop,(Block *)(pEVar3 + 1),(char *)local_a8.delegate_);
          if (pEVar3->type_ == Loop) goto LAB_00142f5f;
        }
        __function = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
        ;
        goto LAB_00143042;
      }
      if (EVar1 != Try) goto LAB_00142e26;
      Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Try_Opcode);
      WriteBeginBlock(this,Try,(Block *)(pEVar3 + 1),(char *)local_a8.delegate_);
      WritePuts(this,"(",None);
      WritePuts(this,"do",Newline);
      this->indent_ = this->indent_ + 2;
      FlushExprTreeVector(this,&local_c8);
      WriteFoldedExprList(this,(ExprList *)&pEVar3[5].super_intrusive_list_base<wabt::Expr>.prev_);
      FlushExprTreeStack(this);
      WriteClose(this,Newline);
      if (*(int *)&pEVar3->field_0x3c == 2) {
        WritePuts(this,"(",None);
        Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Delegate_Opcode);
        WritePuts(this,(char *)local_a8.delegate_,Space);
        WriteVar(this,(Var *)&pEVar3[6].loc.filename._M_str,None);
        WritePuts(this,")",Newline);
      }
      else if (*(int *)&pEVar3->field_0x3c == 1) {
        pEVar5 = pEVar3[6].super_intrusive_list_base<wabt::Expr>.next_;
        pEVar3 = pEVar3[6].super_intrusive_list_base<wabt::Expr>.prev_;
        if (pEVar5 != pEVar3) {
          exprs = (ExprList *)&pEVar5[1].loc.field_1;
          do {
            WritePuts(this,"(",None);
            if ((*(int *)&exprs[-2].last_ == 0) && ((int)exprs[-2].size_ == -1)) {
              WritePuts(this,"catch_all",Newline);
            }
            else {
              Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Catch_Opcode);
              WritePuts(this,(char *)local_a8.delegate_,Space);
              WriteVar(this,(Var *)(exprs + -3),Newline);
            }
            this->indent_ = this->indent_ + 2;
            WriteFoldedExprList(this,exprs);
            FlushExprTreeStack(this);
            WriteClose(this,Newline);
            pEVar5 = (Expr *)(exprs + 1);
            exprs = (ExprList *)&exprs[5].last_;
          } while (pEVar5 != pEVar3);
        }
      }
LAB_00142f79:
      expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)0x2;
      WriteClose(this,Newline);
      ModuleContext::EndBlock(&this->super_ModuleContext);
    }
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector(&local_c8);
    pEVar6 = pEVar6 + 1;
  } while( true );
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}